

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::syntax::PackageImportItemSyntax_const*>::
emplace_back<slang::syntax::PackageImportItemSyntax_const*const&>
          (SmallVectorBase<slang::syntax::PackageImportItemSyntax_const*> *this,
          PackageImportItemSyntax **args)

{
  iterator ppPVar1;
  PackageImportItemSyntax **args_local;
  SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*> *this_local;
  
  if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
    ppPVar1 = SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*>::end
                        ((SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*> *)this);
    this_local = (SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*> *)
                 emplaceRealloc<slang::syntax::PackageImportItemSyntax_const*const&>
                           (this,ppPVar1,args);
  }
  else {
    ppPVar1 = SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*>::end
                        ((SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*> *)this);
    *ppPVar1 = *args;
    *(long *)(this + 8) = *(long *)(this + 8) + 1;
    this_local = (SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*> *)
                 SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*>::back
                           ((SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*> *)this)
    ;
  }
  return (reference)this_local;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }